

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.h
# Opt level: O0

uint64_t __thiscall Minisat::SimpSolver::ElimLt::cost(ElimLt *this,Var x)

{
  vec<int> *pvVar1;
  Lit LVar2;
  int iVar3;
  int index;
  int *piVar4;
  Var in_ESI;
  undefined8 *in_RDI;
  
  pvVar1 = (vec<int> *)*in_RDI;
  LVar2 = mkLit(in_ESI,false);
  iVar3 = toInt(LVar2);
  piVar4 = vec<int>::operator[](pvVar1,iVar3);
  iVar3 = *piVar4;
  pvVar1 = (vec<int> *)*in_RDI;
  LVar2 = mkLit(in_ESI,false);
  LVar2 = operator~(LVar2);
  index = toInt(LVar2);
  piVar4 = vec<int>::operator[](pvVar1,index);
  return (long)iVar3 * (long)*piVar4;
}

Assistant:

uint64_t cost(Var x) const { return (uint64_t)n_occ[toInt(mkLit(x))] * (uint64_t)n_occ[toInt(~mkLit(x))]; }